

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeevents.cpp
# Opt level: O3

void __thiscall YAML::NodeEvents::Setup(NodeEvents *this,node *node)

{
  int iVar1;
  node_data *this_00;
  node *node_00;
  value vVar2;
  mapped_type_conflict *pmVar3;
  node *__range2;
  const_node_iterator __begin2;
  const_node_iterator __end2;
  const_node_iterator local_58;
  const_node_iterator local_38;
  
  local_58._0_8_ =
       (node->m_pRef).super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pmVar3 = std::
           map<const_YAML::detail::node_ref_*,_int,_std::less<const_YAML::detail::node_ref_*>,_std::allocator<std::pair<const_YAML::detail::node_ref_*const,_int>_>_>
           ::operator[](&this->m_refCount,(key_type *)&local_58);
  iVar1 = *pmVar3;
  *pmVar3 = iVar1 + 1;
  if (iVar1 < 1) {
    this_00 = (((node->m_pRef).
                super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    vVar2 = Undefined;
    if (this_00->m_isDefined != false) {
      vVar2 = this_00->m_type;
    }
    if (vVar2 == Map) {
      detail::node_data::begin(&local_58,this_00);
      detail::node_data::end
                (&local_38,
                 (((node->m_pRef).
                   super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      do {
        if (local_58.m_type == local_38.m_type) {
          if (local_58.m_type == Sequence) {
            if (local_58.m_seqIt._M_current == local_38.m_seqIt._M_current) {
              return;
            }
          }
          else {
            if (local_58.m_type != Map) {
              return;
            }
            if (local_58.m_mapIt._M_current == local_38.m_mapIt._M_current) {
              return;
            }
          }
        }
        node_00 = (local_58.m_mapIt._M_current)->second;
        Setup(this,(local_58.m_mapIt._M_current)->first);
        Setup(this,node_00);
        detail::node_iterator_base<const_YAML::detail::node>::operator++(&local_58);
      } while( true );
    }
    if (vVar2 == Sequence) {
      detail::node_data::begin(&local_58,this_00);
      detail::node_data::end
                (&local_38,
                 (((node->m_pRef).
                   super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      do {
        if (local_58.m_type == local_38.m_type) {
          if (local_58.m_type == Sequence) {
            if (local_58.m_seqIt._M_current == local_38.m_seqIt._M_current) {
              return;
            }
          }
          else {
            if (local_58.m_type != Map) {
              return;
            }
            if (local_58.m_mapIt._M_current == local_38.m_mapIt._M_current) {
              return;
            }
          }
        }
        Setup(this,*local_58.m_seqIt._M_current);
        detail::node_iterator_base<const_YAML::detail::node>::operator++(&local_58);
      } while( true );
    }
  }
  return;
}

Assistant:

void NodeEvents::Setup(const detail::node& node) {
  int& refCount = m_refCount[node.ref()];
  refCount++;
  if (refCount > 1)
    return;

  if (node.type() == NodeType::Sequence) {
    for (auto element : node)
      Setup(*element);
  } else if (node.type() == NodeType::Map) {
    for (auto element : node) {
      Setup(*element.first);
      Setup(*element.second);
    }
  }
}